

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O3

void __thiscall
uWS::WebSocket<false>::sendPrepared
          (WebSocket<false> *this,PreparedMessage *preparedMessage,void *callbackData)

{
  long lVar1;
  undefined8 *puVar2;
  ssize_t sVar3;
  _func_void_void_ptr_void_ptr_bool_void_ptr *p_Var4;
  size_t in_RCX;
  bool bVar5;
  PreparedMessage *preparedMessage_1;
  int iVar6;
  uv_poll_t *puVar7;
  char *memory;
  bool wasTransferred;
  char local_29;
  
  preparedMessage->references = preparedMessage->references + 1;
  lVar1 = *(long *)(*((this->super_Socket).p)->data + 0x28);
  puVar2 = *(undefined8 **)(lVar1 + 0x18);
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)operator_new__(0x30);
  }
  else {
    *(undefined8 *)(lVar1 + 0x18) = 0;
  }
  *puVar2 = preparedMessage->buffer;
  puVar2[1] = preparedMessage->length;
  sVar3 = uS::Socket::write(&this->super_Socket,(int)puVar2,&local_29,in_RCX);
  if ((char)sVar3 == '\0') {
    puVar7 = (this->super_Socket).p;
    iVar6 = preparedMessage->references + -1;
    preparedMessage->references = iVar6;
    p_Var4 = preparedMessage->callback;
    if (p_Var4 == (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) goto LAB_00114f00;
    bVar5 = true;
  }
  else {
    if (local_29 != '\0') {
      puVar2[3] = sendPrepared::anon_class_1_0_00000001::__invoke;
      puVar2[4] = preparedMessage;
      puVar2[5] = callbackData;
      return;
    }
    lVar1 = *(long *)(*((this->super_Socket).p)->data + 0x28);
    if (*(long *)(lVar1 + 0x18) == 0) {
      *(undefined8 **)(lVar1 + 0x18) = puVar2;
    }
    else {
      operator_delete__(puVar2);
    }
    puVar7 = (this->super_Socket).p;
    iVar6 = preparedMessage->references + -1;
    preparedMessage->references = iVar6;
    p_Var4 = preparedMessage->callback;
    if (p_Var4 == (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) goto LAB_00114f00;
    bVar5 = false;
  }
  (*p_Var4)(puVar7,callbackData,bVar5,SUB18(iVar6 == 0,0));
LAB_00114f00:
  if (iVar6 == 0) {
    if (preparedMessage->buffer != (char *)0x0) {
      operator_delete__(preparedMessage->buffer);
    }
    operator_delete(preparedMessage);
  }
  return;
}

Assistant:

void WebSocket<isServer>::sendPrepared(typename WebSocket<isServer>::PreparedMessage *preparedMessage, void *callbackData) {
    preparedMessage->references++;
    void (*callback)(void *webSocket, void *userData, bool cancelled, void *reserved) = [](void *webSocket, void *userData, bool cancelled, void *reserved) {
        PreparedMessage *preparedMessage = (PreparedMessage *) userData;
        bool lastReference = !--preparedMessage->references;

        if (preparedMessage->callback) {
            preparedMessage->callback(webSocket, reserved, cancelled, (void *) lastReference);
        }

        if (lastReference) {
            delete [] preparedMessage->buffer;
            delete preparedMessage;
        }
    };

    // candidate for fixed size pool allocator
    int memoryLength = sizeof(uS::SocketData::Queue::Message);
    int memoryIndex = getSocketData()->nodeData->getMemoryBlockIndex(memoryLength);

    uS::SocketData::Queue::Message *messagePtr = (uS::SocketData::Queue::Message *) getSocketData()->nodeData->getSmallMemoryBlock(memoryIndex);
    messagePtr->data = preparedMessage->buffer;
    messagePtr->length = preparedMessage->length;

    bool wasTransferred;
    if (write(messagePtr, wasTransferred)) {
        if (!wasTransferred) {
            getSocketData()->nodeData->freeSmallMemoryBlock((char *) messagePtr, memoryIndex);
            if (callback) {
                callback(*this, preparedMessage, false, callbackData);
            }
        } else {
            messagePtr->callback = callback;
            messagePtr->callbackData = preparedMessage;
            messagePtr->reserved = callbackData;
        }
    } else {
        if (callback) {
            callback(*this, preparedMessage, true, callbackData);
        }
    }
}